

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_allocator_adaptor.hpp
# Opt level: O3

pointer __thiscall
boost::alignment::
aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>,_64UL>
::allocate(aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>,_64UL>
           *this,size_type size)

{
  void *pvVar1;
  pointer pvVar2;
  uintptr_t __intptr;
  ulong uVar3;
  
  uVar3 = size * 0x40 + 0x47;
  if (-1 < (long)uVar3) {
    pvVar1 = operator_new(uVar3);
    pvVar2 = (pointer)((long)pvVar1 + 0x47U & 0xffffffffffffffc0);
    if (0x3f < (ulong)((long)pvVar2 - ((long)pvVar1 + 8))) {
      pvVar2 = (pointer)((long)pvVar1 + 8);
    }
    *(void **)&pvVar2[-1].field_0x38 = pvVar1;
    return pvVar2;
  }
  std::__throw_bad_alloc();
}

Assistant:

pointer allocate(size_type size) {
        enum {
            m = min_align<value_type>::value
        };
        std::size_t s = size * sizeof(value_type);
        std::size_t n = s + m - 1;
        char_alloc a(base());
        char_ptr p = a.allocate(sizeof p + n);
        void* r = boost::to_address(p) + sizeof p;
        (void)boost::alignment::align(m, s, r, n);
        ::new(static_cast<void*>(static_cast<char_ptr*>(r) - 1)) char_ptr(p);
        return static_cast<pointer>(r);
    }